

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::truncate
          (ArrayBuilder<kj::Promise<void>_> *this,char *__file,__off_t __length)

{
  Promise<void> *pPVar1;
  Promise<void> *pPVar2;
  PromiseArenaMember *node;
  
  pPVar1 = this->ptr;
  pPVar2 = this->pos;
  while (pPVar1 + (long)__file < pPVar2) {
    this->pos = pPVar2 + -1;
    node = &(pPVar2[-1].super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    if (node != (PromiseArenaMember *)0x0) {
      pPVar2[-1].super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    pPVar2 = this->pos;
  }
  return (int)pPVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }